

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  bool bVar1;
  Size SVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Var VVar7;
  uint *puVar8;
  Clause *pCVar9;
  Lit *pLVar10;
  char *pcVar11;
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  size_t in_R8;
  Size local_88;
  int i_3;
  lbool local_71;
  uint local_70;
  int local_6c;
  int i_2;
  int local_64;
  lbool local_5d;
  int local_5c;
  Clause *pCStack_58;
  int j;
  Clause *c;
  int i_1;
  int local_3c;
  uint local_38;
  int i;
  int cnt;
  Var max;
  vec<int,_int> map;
  vec<Minisat::Lit,_int> *assumps_local;
  FILE *f_local;
  Solver *this_local;
  
  map._8_8_ = assumps;
  if ((this->ok & 1U) == 0) {
    fprintf((FILE *)f,"p cnf 1 2\n1 0\n-1 0\n");
  }
  else {
    vec<int,_int>::vec((vec<int,_int> *)&cnt);
    i = 0;
    local_38 = 0;
    for (local_3c = 0; iVar4 = local_3c, SVar2 = vec<unsigned_int,_int>::size(&this->clauses),
        iVar4 < SVar2; local_3c = local_3c + 1) {
      puVar8 = vec<unsigned_int,_int>::operator[](&this->clauses,local_3c);
      pCVar9 = ClauseAllocator::operator[](&this->ca,*puVar8);
      bVar1 = satisfied(this,pCVar9);
      if (!bVar1) {
        local_38 = local_38 + 1;
      }
    }
    for (c._0_4_ = 0; iVar4 = (int)c, SVar2 = vec<unsigned_int,_int>::size(&this->clauses),
        iVar4 < SVar2; c._0_4_ = (int)c + 1) {
      puVar8 = vec<unsigned_int,_int>::operator[](&this->clauses,(int)c);
      pCVar9 = ClauseAllocator::operator[](&this->ca,*puVar8);
      bVar1 = satisfied(this,pCVar9);
      if (!bVar1) {
        puVar8 = vec<unsigned_int,_int>::operator[](&this->clauses,(int)c);
        pCStack_58 = ClauseAllocator::operator[](&this->ca,*puVar8);
        for (local_5c = 0; iVar4 = local_5c, iVar3 = Clause::size(pCStack_58), iVar4 < iVar3;
            local_5c = local_5c + 1) {
          pLVar10 = Clause::operator[](pCStack_58,local_5c);
          local_64 = pLVar10->x;
          local_5d = value(this,(Lit)local_64);
          i_2._3_1_ = l_False.value;
          bVar1 = lbool::operator!=(&local_5d,l_False);
          if (bVar1) {
            pLVar10 = Clause::operator[](pCStack_58,local_5c);
            local_6c = pLVar10->x;
            iVar4 = var((Lit)local_6c);
            mapVar(iVar4,(vec<int,_int> *)&cnt,&i);
          }
        }
      }
    }
    SVar2 = vec<Minisat::Lit,_int>::size((vec<Minisat::Lit,_int> *)map._8_8_);
    local_38 = SVar2 + local_38;
    fprintf((FILE *)f,"p cnf %d %d\n",(ulong)(uint)i,(ulong)local_38);
    local_70 = 0;
    while( true ) {
      uVar6 = local_70;
      uVar5 = vec<Minisat::Lit,_int>::size((vec<Minisat::Lit,_int> *)map._8_8_);
      tbs = (uchar *)(ulong)uVar5;
      if ((int)uVar5 <= (int)uVar6) break;
      pLVar10 = vec<Minisat::Lit,_int>::operator[]((vec<Minisat::Lit,_int> *)map._8_8_,local_70);
      local_71 = value(this,(Lit)pLVar10->x);
      bVar1 = lbool::operator!=(&local_71,l_False);
      if (!bVar1) {
        __assert_fail("value(assumps[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x3d3,"void Minisat::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      sig = (uchar *)(ulong)local_70;
      pLVar10 = vec<Minisat::Lit,_int>::operator[]((vec<Minisat::Lit,_int> *)map._8_8_,local_70);
      uVar6 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar10->x,sig,siglen,tbs,in_R8);
      pcVar11 = "";
      if ((uVar6 & 1) != 0) {
        pcVar11 = "-";
      }
      pLVar10 = vec<Minisat::Lit,_int>::operator[]((vec<Minisat::Lit,_int> *)map._8_8_,local_70);
      iVar4 = var((Lit)pLVar10->x);
      VVar7 = mapVar(iVar4,(vec<int,_int> *)&cnt,&i);
      fprintf((FILE *)f,"%s%d 0\n",pcVar11,(ulong)(VVar7 + 1));
      local_70 = local_70 + 1;
    }
    for (local_88 = 0; SVar2 = vec<unsigned_int,_int>::size(&this->clauses), local_88 < SVar2;
        local_88 = local_88 + 1) {
      puVar8 = vec<unsigned_int,_int>::operator[](&this->clauses,local_88);
      pCVar9 = ClauseAllocator::operator[](&this->ca,*puVar8);
      toDimacs(this,f,pCVar9,(vec<int,_int> *)&cnt,&i);
    }
    if (0 < this->verbosity) {
      printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)(uint)i,(ulong)local_38);
    }
    vec<int,_int>::~vec((vec<int,_int> *)&cnt);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}